

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorPickerOptionsPopup(float *ref_col,ImGuiColorEditFlags flags)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  undefined1 local_48 [8];
  ImVec4 previewing_ref_col;
  ImVec2 backup_pos;
  ImGuiColorEditFlags picker_flags;
  int picker_type;
  ImVec2 picker_size;
  ImGuiContext *g;
  bool allow_opt_alpha_bar;
  bool allow_opt_picker;
  ImGuiColorEditFlags flags_local;
  float *ref_col_local;
  
  bVar5 = (flags & 0x6000000U) == 0;
  bVar2 = (flags & 2U) == 0 && (flags & 0x10000U) == 0;
  if (((bVar5) || (bVar2)) && (bVar3 = BeginPopup("context",0), bVar3)) {
    picker_size = (ImVec2)GImGui;
    if (bVar5) {
      fVar1 = GImGui->FontSize;
      fVar7 = GImGui->FontSize;
      fVar6 = GetFrameHeight();
      fVar7 = ImMax<float>(fVar7 * 8.0 + -(fVar6 + *(float *)((long)picker_size + 0x1694)),1.0);
      ImVec2::ImVec2((ImVec2 *)&picker_flags,fVar1 * 8.0,fVar7);
      PushItemWidth((float)picker_flags);
      for (backup_pos.y = 0.0; (int)backup_pos.y < 2; backup_pos.y = (float)((int)backup_pos.y + 1))
      {
        if (0 < (int)backup_pos.y) {
          Separator();
        }
        PushID((int)backup_pos.y);
        backup_pos.x = (float)(flags & 2U | 0x1a8);
        if (backup_pos.y == 0.0) {
          backup_pos.x = (float)(flags & 2U | 0x20001a8);
        }
        if (backup_pos.y == 1.4013e-45) {
          backup_pos.x = (float)((uint)backup_pos.x | 0x4000000);
        }
        previewing_ref_col._8_8_ = GetCursorScreenPos();
        bVar3 = Selectable("##selectable",false,0,(ImVec2 *)&picker_flags);
        if (bVar3) {
          *(uint *)((long)picker_size + 0x316c) =
               *(uint *)((long)picker_size + 0x316c) & 0xf9ffffff | (uint)backup_pos.x & 0x6000000;
        }
        SetCursorScreenPos((ImVec2 *)&previewing_ref_col.z);
        ImVec4::ImVec4((ImVec4 *)local_48);
        iVar4 = 4;
        if (((uint)backup_pos.x & 2) != 0) {
          iVar4 = 3;
        }
        memcpy(local_48,ref_col,(long)iVar4 << 2);
        ColorPicker4("##previewing_picker",(float *)local_48,(ImGuiColorEditFlags)backup_pos.x,
                     (float *)0x0);
        PopID();
      }
      PopItemWidth();
    }
    if (bVar2) {
      if (bVar5) {
        Separator();
      }
      CheckboxFlags("Alpha Bar",(int *)((long)picker_size + 0x316c),0x10000);
    }
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorPickerOptionsPopup(const float* ref_col, ImGuiColorEditFlags flags)
{
    bool allow_opt_picker = !(flags & ImGuiColorEditFlags_PickerMask_);
    bool allow_opt_alpha_bar = !(flags & ImGuiColorEditFlags_NoAlpha) && !(flags & ImGuiColorEditFlags_AlphaBar);
    if ((!allow_opt_picker && !allow_opt_alpha_bar) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    if (allow_opt_picker)
    {
        ImVec2 picker_size(g.FontSize * 8, ImMax(g.FontSize * 8 - (GetFrameHeight() + g.Style.ItemInnerSpacing.x), 1.0f)); // FIXME: Picker size copied from main picker function
        PushItemWidth(picker_size.x);
        for (int picker_type = 0; picker_type < 2; picker_type++)
        {
            // Draw small/thumbnail version of each picker type (over an invisible button for selection)
            if (picker_type > 0) Separator();
            PushID(picker_type);
            ImGuiColorEditFlags picker_flags = ImGuiColorEditFlags_NoInputs | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_NoSidePreview | (flags & ImGuiColorEditFlags_NoAlpha);
            if (picker_type == 0) picker_flags |= ImGuiColorEditFlags_PickerHueBar;
            if (picker_type == 1) picker_flags |= ImGuiColorEditFlags_PickerHueWheel;
            ImVec2 backup_pos = GetCursorScreenPos();
            if (Selectable("##selectable", false, 0, picker_size)) // By default, Selectable() is closing popup
                g.ColorEditOptions = (g.ColorEditOptions & ~ImGuiColorEditFlags_PickerMask_) | (picker_flags & ImGuiColorEditFlags_PickerMask_);
            SetCursorScreenPos(backup_pos);
            ImVec4 previewing_ref_col;
            memcpy(&previewing_ref_col, ref_col, sizeof(float) * ((picker_flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4));
            ColorPicker4("##previewing_picker", &previewing_ref_col.x, picker_flags);
            PopID();
        }
        PopItemWidth();
    }
    if (allow_opt_alpha_bar)
    {
        if (allow_opt_picker) Separator();
        CheckboxFlags("Alpha Bar", &g.ColorEditOptions, ImGuiColorEditFlags_AlphaBar);
    }
    EndPopup();
}